

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O3

void __thiscall
duckdb::EncryptionTransport::EncryptionTransport
          (EncryptionTransport *this,TProtocol *prot_p,string *key,EncryptionUtil *encryption_util_p
          )

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Allocator *allocator;
  
  (this->super_TTransport)._vptr_TTransport = (_func_int **)&PTR__EncryptionTransport_019b43a0;
  this->prot = prot_p;
  peVar1 = (prot_p->ptrans_).
           super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = (prot_p->ptrans_).
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this->trans = peVar1;
  (**encryption_util_p->_vptr_EncryptionUtil)(&this->aes,encryption_util_p,key);
  allocator = Allocator::DefaultAllocator();
  ArenaAllocator::ArenaAllocator(&this->allocator,allocator,0x1000);
  Initialize(this,key);
  return;
}

Assistant:

EncryptionTransport(TProtocol &prot_p, const string &key, const EncryptionUtil &encryption_util_p)
	    : prot(prot_p), trans(*prot.getTransport()), aes(encryption_util_p.CreateEncryptionState(&key)),
	      allocator(Allocator::DefaultAllocator(), ParquetCrypto::CRYPTO_BLOCK_SIZE) {
		Initialize(key);
	}